

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.cpp
# Opt level: O3

void __thiscall GcHeap::GcHeapImpl::GcHeapImpl(GcHeapImpl *this)

{
  uint8_t *puVar1;
  long lVar2;
  
  this->number_of_pages = 8;
  (this->forwarding_addresses)._M_h._M_buckets = &(this->forwarding_addresses)._M_h._M_single_bucket
  ;
  (this->forwarding_addresses)._M_h._M_bucket_count = 1;
  (this->forwarding_addresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->forwarding_addresses)._M_h._M_element_count = 0;
  (this->forwarding_addresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->forwarding_addresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->forwarding_addresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->worklist).super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->finalize_queue;
  (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->finalize_queue;
  (this->finalize_queue).super__List_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl._M_node._M_size =
       0;
  puVar1 = MapTheHeap(8);
  this->heap_start = puVar1;
  lVar2 = this->number_of_pages * 0x1000;
  this->heap_end = puVar1 + lVar2;
  this->tospace = puVar1;
  this->extent = lVar2 >> 1;
  this->fromspace = puVar1 + (lVar2 >> 1);
  this->top = puVar1 + (lVar2 >> 1);
  this->free = puVar1;
  this->stress = false;
  this->gc_number = 0;
  if (0 < lVar2) {
    return;
  }
  __assert_fail("heap_start < heap_end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.cpp"
                ,0xa7,"GcHeap::GcHeapImpl::GcHeapImpl()");
}

Assistant:

GcHeapImpl() {
    uint8_t *heap = MapTheHeap(number_of_pages);
    heap_start = heap;
    heap_end = heap_start + PAGE_SIZE * number_of_pages;
    tospace = heap_start;
    extent = (heap_end - heap_start) / 2;
    fromspace = heap_start + extent;
    top = fromspace;
    free = tospace;
    stress = false;
    gc_number = 0;
    assert(heap_start < heap_end);
  }